

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirscanner.h
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall trun::DirScanner::Scan(DirScanner *this,string *fromdir,bool use_recurse)

{
  string local_30;
  
  this->recurse = use_recurse;
  std::__cxx11::string::string((string *)&local_30,fromdir);
  DoScan(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return &this->filenames;
}

Assistant:

std::vector<std::string> &Scan(std::string fromdir, bool use_recurse) {
            this->recurse = use_recurse;
            DoScan(fromdir);
            return filenames;
        }